

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void inputMethodInstantiateCallback(Display *display,XPointer clientData,XPointer callData)

{
  GLFWbool GVar1;
  _GLFWwindow *local_38;
  _GLFWwindow *window;
  XIMCallback callback;
  XPointer callData_local;
  XPointer clientData_local;
  Display *display_local;
  
  if (_glfw.x11.im == (XIM)0x0) {
    callback.callback = (XIMProc)callData;
    _glfw.x11.im = (*_glfw.x11.xlib.OpenIM)
                             (_glfw.x11.display,(XrmDatabase *)0x0,(char *)0x0,(char *)0x0);
    if ((_glfw.x11.im != (XIM)0x0) && (GVar1 = hasUsableInputMethodStyle(), GVar1 == 0)) {
      (*_glfw.x11.xlib.CloseIM)(_glfw.x11.im);
      _glfw.x11.im = (XIM)0x0;
    }
    if (_glfw.x11.im != (XIM)0x0) {
      callback.client_data = (XPointer)inputMethodDestroyCallback;
      window = (_GLFWwindow *)0x0;
      (*_glfw.x11.xlib.SetIMValues)(_glfw.x11.im,"destroyCallback",&window,0);
      for (local_38 = _glfw.windowListHead; local_38 != (_GLFWwindow *)0x0;
          local_38 = local_38->next) {
        _glfwCreateInputContextX11(local_38);
      }
    }
  }
  return;
}

Assistant:

static void inputMethodInstantiateCallback(Display* display,
                                           XPointer clientData,
                                           XPointer callData)
{
    if (_glfw.x11.im)
        return;

    _glfw.x11.im = XOpenIM(_glfw.x11.display, 0, NULL, NULL);
    if (_glfw.x11.im)
    {
        if (!hasUsableInputMethodStyle())
        {
            XCloseIM(_glfw.x11.im);
            _glfw.x11.im = NULL;
        }
    }

    if (_glfw.x11.im)
    {
        XIMCallback callback;
        callback.callback = (XIMProc) inputMethodDestroyCallback;
        callback.client_data = NULL;
        XSetIMValues(_glfw.x11.im, XNDestroyCallback, &callback, NULL);

        for (_GLFWwindow* window = _glfw.windowListHead;  window;  window = window->next)
            _glfwCreateInputContextX11(window);
    }
}